

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::declare_temporary_abi_cxx11_
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id)

{
  anon_class_8_2_3ce7c506_for__M_pred __pred;
  SPIRBlock *pSVar1;
  uint32_t id;
  size_type sVar2;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar3;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar4;
  uint32_t in_ECX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  undefined1 local_c8 [36];
  ID local_a4;
  Bitset *local_a0;
  Bitset *flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  _Node_iterator_base<unsigned_int,_false> local_48;
  char local_40;
  uint32_t local_38;
  uint32_t uStack_34;
  SPIRBlock *local_30;
  SPIRBlock *header;
  SPIRType *type;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,result_type);
  type._0_4_ = in_ECX;
  type._4_4_ = result_id;
  _result_id_local = this_00;
  this_local = this;
  header = (SPIRBlock *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,result_id);
  if ((((this_00->block_temporary_hoisting & 1U) == 0) &&
      (this_00->current_continue_block != (SPIRBlock *)0x0)) &&
     (sVar2 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this_00->super_Compiler).hoisted_temporaries,(key_type *)&type), sVar2 == 0)
     ) {
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&this_00->current_continue_block->loop_dominator);
    local_30 = Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this_00,id);
    ppVar3 = ::std::
             begin<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_30->declare_temporary);
    ppVar4 = ::std::
             end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_30->declare_temporary);
    local_38 = type._4_4_;
    uStack_34 = (uint32_t)type;
    __pred.result_id = (uint32_t)type;
    __pred.result_type = type._4_4_;
    ppVar3 = ::std::
             find_if<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,spirv_cross::CompilerGLSL::declare_temporary[abi:cxx11](unsigned_int,unsigned_int)::__0>
                       (ppVar3,ppVar4,__pred);
    ppVar4 = ::std::
             end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                       (&local_30->declare_temporary);
    if (ppVar3 == ppVar4) {
      SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
      ::emplace_back<unsigned_int&,unsigned_int&>
                ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                  *)&local_30->declare_temporary,(uint *)((long)&type + 4),(uint *)&type);
      pVar5 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this_00->super_Compiler).hoisted_temporaries,(value_type *)&type);
      local_48._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_40 = pVar5.second;
      Compiler::force_recompile_guarantee_forward_progress((Compiler *)this_00);
    }
    (*(this_00->super_Compiler)._vptr_Compiler[6])(local_68,this_00,(ulong)(uint32_t)type,1);
    join<std::__cxx11::string,char_const(&)[4]>((spirv_cross *)this,local_68,(char (*) [4])0x601511)
    ;
    ::std::__cxx11::string::~string((string *)local_68);
    return this;
  }
  sVar2 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this_00->super_Compiler).hoisted_temporaries,(key_type *)&type);
  if (sVar2 == 0) {
    add_local_variable_name(this_00,(uint32_t)type);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_a4,(uint32_t)type);
    local_a0 = Compiler::get_decoration_bitset((Compiler *)this_00,local_a4);
    flags_to_qualifiers_glsl_abi_cxx11_
              ((CompilerGLSL *)local_c8,(SPIRType *)this_00,(Bitset *)header);
    pSVar1 = header;
    (*(this_00->super_Compiler)._vptr_Compiler[6])(local_108,this_00,(ulong)(uint32_t)type,1);
    (*(this_00->super_Compiler)._vptr_Compiler[0x1b])(local_e8,this_00,pSVar1,local_108,0);
    join<std::__cxx11::string,std::__cxx11::string,char_const(&)[4]>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
               local_e8,(char (*) [4])0x601511);
    ::std::__cxx11::string::~string((string *)local_e8);
    ::std::__cxx11::string::~string(local_108);
    ::std::__cxx11::string::~string((string *)local_c8);
  }
  else {
    (*(this_00->super_Compiler)._vptr_Compiler[6])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,this_00,
               (ulong)(uint32_t)type,1);
    join<std::__cxx11::string,char_const(&)[4]>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
               (char (*) [4])0x601511);
    ::std::__cxx11::string::~string((string *)&flags);
  }
  return this;
}

Assistant:

string CompilerGLSL::declare_temporary(uint32_t result_type, uint32_t result_id)
{
	auto &type = get<SPIRType>(result_type);

	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (!block_temporary_hoisting && current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile_guarantee_forward_progress();
		}

		return join(to_name(result_id), " = ");
	}
	else if (hoisted_temporaries.count(result_id))
	{
		// The temporary has already been declared earlier, so just "declare" the temporary by writing to it.
		return join(to_name(result_id), " = ");
	}
	else
	{
		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);
		auto &flags = get_decoration_bitset(result_id);
		return join(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), " = ");
	}
}